

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

uint __thiscall llvm::APInt::countTrailingZerosSlowCase(APInt *this)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong *puVar7;
  
  uVar2 = this->BitWidth;
  if ((ulong)uVar2 == 0) {
    uVar4 = 0;
  }
  else {
    uVar1 = (ulong)uVar2 + 0x3f;
    puVar7 = (this->U).pVal;
    uVar4 = (uint)uVar1 & 0xffffffc0;
    lVar6 = 0;
    do {
      if (*puVar7 != 0) {
        uVar1 = *puVar7;
        if (uVar1 == 0) {
          iVar5 = 0x40;
        }
        else {
          lVar3 = 0;
          if (uVar1 != 0) {
            for (; (uVar1 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          iVar5 = (int)lVar3;
        }
        uVar4 = iVar5 - (int)lVar6;
        break;
      }
      puVar7 = puVar7 + 1;
      lVar6 = lVar6 + -0x40;
    } while ((uVar1 & 0xffffffffffffffc0) + lVar6 != 0);
  }
  if (uVar2 < uVar4) {
    uVar4 = uVar2;
  }
  return uVar4;
}

Assistant:

unsigned APInt::countTrailingZerosSlowCase() const {
  unsigned Count = 0;
  unsigned i = 0;
  for (; i < getNumWords() && U.pVal[i] == 0; ++i)
    Count += APINT_BITS_PER_WORD;
  if (i < getNumWords())
    Count += llvm::countTrailingZeros(U.pVal[i]);
  return std::min(Count, BitWidth);
}